

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O0

void __thiscall model::undateIntercept(model *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  size_t *in_RCX;
  uchar *sig;
  EVP_PKEY_CTX *in_RSI;
  uchar *in_R8;
  size_t in_R9;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  double dVar4;
  model *this_local;
  
  std::abs((int)this);
  if (this->lambda1 < extraout_XMM0_Da) {
    fVar1 = this->z_intercept;
    sign(this,in_RSI,sig,in_RCX,in_R8,in_R9);
    fVar2 = this->lambda1;
    fVar3 = this->beta;
    dVar4 = std::sqrt((double)(ulong)(uint)this->n_intercept);
    this->w_intercept =
         -(-extraout_XMM0_Da_00 * fVar2 + fVar1) /
         ((fVar3 + SUB84(dVar4,0)) / this->alpha + this->lambda2);
  }
  else {
    this->w_intercept = 0.0;
  }
  return;
}

Assistant:

void model::undateIntercept() {
    if (abs(z_intercept) <= lambda1) {
        w_intercept = 0;
    } else {
        w_intercept = -(z_intercept - sign(z_intercept) * lambda1) / ((beta + sqrt(n_intercept)) / alpha + lambda2);
    }
}